

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Amr *pAVar5;
  LevelBld *ptr;
  int *piVar6;
  Real RVar7;
  Real run_stop;
  int IOProc;
  int max_coarsening_level;
  Amr *amrptr;
  ParmParse pp;
  Real stop_interval;
  Real stop_time;
  Real strt_time;
  int num_steps;
  int max_step;
  Real run_strt;
  int in_stack_000035f8;
  int in_stack_000035fc;
  Geometry *in_stack_00003600;
  char (*x) [28];
  function<void_()> *in_stack_fffffffffffffb40;
  Amr *this;
  string *in_stack_fffffffffffffb48;
  Amr *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  undefined4 in_stack_fffffffffffffb70;
  undefined2 in_stack_fffffffffffffb74;
  undefined1 in_stack_fffffffffffffb76;
  undefined1 in_stack_fffffffffffffb77;
  undefined1 uVar8;
  undefined8 in_stack_fffffffffffffbb8;
  double *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  ParmParse *this_00;
  LevelBld *in_stack_fffffffffffffc28;
  Amr *in_stack_fffffffffffffc30;
  double local_298;
  int local_290;
  undefined1 local_289;
  ostream *in_stack_fffffffffffffeb0;
  function<void_()> *in_stack_fffffffffffffeb8;
  MPI_Comm in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  char ***in_stack_fffffffffffffec8;
  int *in_stack_fffffffffffffed0;
  ostream *in_stack_fffffffffffffee0;
  ErrorHandler in_stack_fffffffffffffee8;
  int local_100 [2];
  Amr *local_f8;
  ParmParse local_f0;
  double local_78;
  double local_70;
  double local_68;
  int local_60;
  int local_5c;
  double local_58;
  int local_14;
  char *local_10;
  char *local_8;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20);
  local_14 = 0;
  std::function<void_()>::function(in_stack_fffffffffffffb40);
  x = (char (*) [28])&std::cerr;
  this = (Amr *)0x0;
  amrex::Initialize(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                    (bool)in_stack_fffffffffffffec7,in_stack_fffffffffffffec0,
                    in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffee0,
                    in_stack_fffffffffffffee8);
  std::function<void_()>::~function((function<void_()> *)0x1122745);
  local_58 = amrex::ParallelDescriptor::second();
  this_00 = &local_f0;
  std::__cxx11::string::string((string *)this_00);
  amrex::ParmParse::ParmParse((ParmParse *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  std::__cxx11::string::~string((string *)&local_f0);
  local_5c = -1;
  local_60 = -1;
  local_68 = 0.0;
  local_70 = -1.0;
  local_78 = 0.0;
  amrex::ParmParse::query(this_00,in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0,iVar2);
  amrex::ParmParse::query(this_00,in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0,iVar2);
  amrex::ParmParse::query(this_00,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,iVar2);
  amrex::ParmParse::query(this_00,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,iVar2);
  amrex::ParmParse::query(this_00,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,iVar2);
  if (local_68 < 0.0) {
    local_8 = "MUST SPECIFY a non-negative strt_time";
    amrex::Abort_host((char *)in_stack_fffffffffffffb50);
  }
  if ((local_5c < 0) && (local_70 < 0.0)) {
    local_10 = "Exiting because neither max_step nor stop_time is non-negative.";
    amrex::Abort_host((char *)in_stack_fffffffffffffb50);
  }
  pAVar5 = (Amr *)operator_new(0xab0);
  ptr = getLevelBld();
  amrex::Amr::Amr(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  local_f8 = pAVar5;
  amrex::AmrLevel::SetEBSupportLevel(full);
  amrex::AmrLevel::SetEBMaxGrowCells(6,6,6);
  local_100[1] = 100;
  amrex::ParmParse::query(this_00,(char *)pAVar5,(int *)ptr,iVar2);
  pAVar5 = local_f8;
  amrex::AmrMesh::maxLevel((AmrMesh *)local_f8);
  amrex::AmrMesh::Geom((AmrMesh *)this,(int)((ulong)x >> 0x20));
  amrex::AmrMesh::maxLevel((AmrMesh *)local_f8);
  initialize_EB2(in_stack_00003600,in_stack_000035fc,in_stack_000035f8);
  (*(local_f8->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xb])(local_68);
  if (0.0 < local_78) {
    RVar7 = amrex::Amr::cumTime(local_f8);
    local_70 = RVar7 + local_78;
  }
  iVar2 = local_60;
  if (0 < local_60) {
    iVar3 = (int)((ulong)x >> 0x20);
    if (local_5c < 0) {
      local_5c = amrex::Amr::levelSteps(this,iVar3);
      local_5c = iVar2 + local_5c;
    }
    else {
      local_100[0] = amrex::Amr::levelSteps(this,iVar3);
      local_100[0] = iVar2 + local_100[0];
      piVar6 = std::min<int>(&local_5c,local_100);
      local_5c = *piVar6;
    }
    amrex::OutStream();
    amrex::Print::Print((Print *)CONCAT17(in_stack_fffffffffffffb77,
                                          CONCAT16(in_stack_fffffffffffffb76,
                                                   CONCAT24(in_stack_fffffffffffffb74,
                                                            in_stack_fffffffffffffb70))),
                        (ostream *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    amrex::Print::operator<<((Print *)this,x);
    amrex::Print::operator<<((Print *)this,(int *)x);
    local_289 = 10;
    amrex::Print::operator<<((Print *)this,*x);
    amrex::Print::~Print((Print *)pAVar5);
  }
  bVar1 = amrex::Amr::RegridOnRestart(local_f8);
  if ((bVar1) &&
     ((iVar2 = amrex::Amr::levelSteps(this,(int)((ulong)x >> 0x20)), local_5c <= iVar2 ||
      ((0.0 <= local_70 && (RVar7 = amrex::Amr::cumTime(local_f8), local_70 <= RVar7)))))) {
    amrex::Amr::cumTime(local_f8);
    amrex::Amr::RegridOnly
              (in_stack_fffffffffffffb50,(Real)in_stack_fffffffffffffb48,
               SUB81((ulong)this >> 0x38,0));
  }
  while( true ) {
    iVar2 = amrex::Amr::okToContinue(in_stack_fffffffffffffb50);
    uVar8 = false;
    if ((iVar2 != 0) &&
       ((iVar2 = amrex::Amr::levelSteps(this,(int)((ulong)x >> 0x20)), iVar2 < local_5c ||
        (uVar8 = false, local_5c < 0)))) {
      RVar7 = amrex::Amr::cumTime(local_f8);
      in_stack_fffffffffffffb76 = RVar7 < local_70 || local_70 < 0.0;
      uVar8 = in_stack_fffffffffffffb76;
    }
    if ((bool)uVar8 == false) break;
    (*(local_f8->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xc])(local_70);
  }
  iVar2 = amrex::Amr::stepOfLastCheckPoint(local_f8);
  iVar3 = amrex::Amr::levelSteps(this,(int)((ulong)x >> 0x20));
  if (iVar2 < iVar3) {
    (*(local_f8->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xf])();
  }
  iVar3 = amrex::Amr::stepOfLastPlotFile(local_f8);
  iVar4 = amrex::Amr::levelSteps(this,(int)((ulong)x >> 0x20));
  if (iVar3 < iVar4) {
    (*(local_f8->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xd])();
  }
  if (local_f8 != (Amr *)0x0) {
    (*(local_f8->super_AmrCore).super_AmrMesh._vptr_AmrMesh[1])();
  }
  local_290 = amrex::ParallelDescriptor::IOProcessorNumber();
  local_298 = amrex::ParallelDescriptor::second();
  local_298 = local_298 - local_58;
  amrex::ParallelDescriptor::ReduceRealMax<double>(&local_298,local_290);
  amrex::OutStream();
  amrex::Print::Print((Print *)CONCAT17(uVar8,CONCAT16(in_stack_fffffffffffffb76,
                                                       CONCAT24(in_stack_fffffffffffffb74,iVar2))),
                      (ostream *)CONCAT44(iVar3,in_stack_fffffffffffffb68));
  amrex::Print::operator<<((Print *)this,(char (*) [12])x);
  amrex::Print::operator<<((Print *)this,(double *)x);
  amrex::Print::operator<<
            ((Print *)this,
             (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
              *)x);
  amrex::Print::~Print((Print *)pAVar5);
  amrex::Finalize();
  local_14 = 0;
  amrex::ParmParse::~ParmParse((ParmParse *)0x1122e6e);
  return local_14;
}

Assistant:

int
main (int   argc,
      char* argv[])
{
    amrex::Initialize(argc,argv);

    BL_PROFILE_REGION_START("main()");
    BL_PROFILE_VAR("main()", pmain);

    const Real run_strt = ParallelDescriptor::second();

    int  max_step;
    int  num_steps;
    Real strt_time;
    Real stop_time;
    Real stop_interval;

    ParmParse pp;

    max_step  = -1;
    num_steps = -1;
    strt_time =  0.0;
    stop_time = -1.0;
    stop_interval = 0.;

    pp.query("max_step",  max_step);
    pp.query("num_steps", num_steps);
    pp.query("strt_time", strt_time);
    pp.query("stop_time", stop_time);
    pp.query("stop_interval", stop_interval);

    if (strt_time < 0.0)
    {
        amrex::Abort("MUST SPECIFY a non-negative strt_time");
    }

    if (max_step < 0 && stop_time < 0)
    {
        amrex::Abort("Exiting because neither max_step nor stop_time is non-negative.");
    }

    Amr* amrptr = new Amr(getLevelBld());
    //    Amr amr;
#ifdef AMREX_USE_EB
    // fixme? not sure what level of support should be default
    // levels explianed in user guide
    // Ann suggested we need vol and area frac, and face and area centroid => full
    AmrLevel::SetEBSupportLevel(EBSupport::full);
    // set grow cells for basic, volume, full
    // fixme? not sure what these numbers should be
    // AmrLevel.cpp defaults 5, 4, 2
    // CNS::numGrow()= 5
    //AmrLevel::SetEBMaxGrowCells(CNS::numGrow(),4,2);
    // NavierStokesBase GEOM_GROW=1 currently. Change it? Make new var?
    // 4 ghost nodes would be enough for EB-MOL, but 6 are necessary for
    // EB-godunov when StateRedist is used so we will use 6.
    AmrLevel::SetEBMaxGrowCells(6,6,6);

    //decide who should own max_coasening_level later
    int max_coarsening_level = 100;
    pp.query("max_coarsening_level", max_coarsening_level);
    initialize_EB2(amrptr->Geom(amrptr->maxLevel()), amrptr->maxLevel(),
		   max_coarsening_level);
#endif

    amrptr->init(strt_time,stop_time);

    // This feature stop the simulation at a specfic time
    // after the physical time of the checkpoint file
    if (stop_interval > 0.) stop_time = amrptr->cumTime() + stop_interval;

    if (num_steps > 0)
    {
        if (max_step < 0)
        {
            max_step = num_steps + amrptr->levelSteps(0);
        }
        else
        {
            max_step = std::min(max_step, num_steps + amrptr->levelSteps(0));
        }

	amrex::Print() << "Using effective max_step = " << max_step << '\n';
    }
    //
    // If we set the regrid_on_restart flag and if we are *not* going to take
    // a time step then we want to go ahead and regrid here.
    //
    if (amrptr->RegridOnRestart())
    {
        if (    (amrptr->levelSteps(0) >= max_step ) ||
                ( (stop_time >= 0.0) &&
                  (amrptr->cumTime() >= stop_time)  )    )
        {
            //
            // Regrid only!
            //
            amrptr->RegridOnly(amrptr->cumTime());
        }
    }

    while ( amrptr->okToContinue()                            &&
           (amrptr->levelSteps(0) < max_step || max_step < 0) &&
           (amrptr->cumTime() < stop_time || stop_time < 0.0) )
    {
        amrptr->coarseTimeStep(stop_time);
    }
    //
    // Write final checkpoint and plotfile.
    //
    if (amrptr->stepOfLastCheckPoint() < amrptr->levelSteps(0))
    {
        amrptr->checkPoint();
    }

    if (amrptr->stepOfLastPlotFile() < amrptr->levelSteps(0))
    {
        amrptr->writePlotFile();
    }

    delete amrptr;

    const int IOProc   = ParallelDescriptor::IOProcessorNumber();
    Real      run_stop = ParallelDescriptor::second() - run_strt;

    ParallelDescriptor::ReduceRealMax(run_stop,IOProc);

    amrex::Print() << "Run time = " << run_stop << std::endl;

    BL_PROFILE_VAR_STOP(pmain);
    BL_PROFILE_REGION_STOP("main()");
    BL_PROFILE_SET_RUN_TIME(run_stop);
    BL_PROFILE_FINALIZE();


    amrex::Finalize();

    return 0;
}